

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

size_t __thiscall
CoreML::Specification::ScatterNDLayerParams::ByteSizeLong(ScatterNDLayerParams *this)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  
  uVar1 = this->mode_;
  if (uVar1 == 0) {
    sVar3 = 0;
  }
  else if ((int)uVar1 < 0) {
    sVar3 = 0xb;
  }
  else {
    iVar2 = 0x1f;
    if ((uVar1 | 1) != 0) {
      for (; (uVar1 | 1) >> iVar2 == 0; iVar2 = iVar2 + -1) {
      }
    }
    sVar3 = (size_t)((iVar2 * 9 + 0x49U >> 6) + 1);
  }
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

inline ::CoreML::Specification::ScatterMode ScatterNDLayerParams::mode() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.ScatterNDLayerParams.mode)
  return static_cast< ::CoreML::Specification::ScatterMode >(mode_);
}